

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O2

void KConfigExport::dump_header(MetaConfiguration *conf,string *filename,string *exportHeader)

{
  MetaClass *top;
  QDebug *debug;
  ostream *poVar1;
  string export_name;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ofstream header;
  
  dumpKConfigSource();
  if ((dumpKConfigSource()::category[0x10] & 1) != 0) {
    dumpKConfigSource();
    _header = 2;
    QMessageLogger::debug();
    debug = QDebug::operator<<((QDebug *)&export_name,"Starting to dump the source file into");
    operator<<(debug,filename);
    QDebug::~QDebug((QDebug *)&export_name);
  }
  std::ofstream::ofstream((ostream *)&header,(string *)filename,_S_out);
  poVar1 = std::operator<<((ostream *)&header,"// clang-format off");
  std::endl<char,std::char_traits<char>>(poVar1);
  begin_header_guards(&header,filename);
  std::endl<char,std::char_traits<char>>((ostream *)&header);
  dump_notice(&header);
  export_name._M_dataplus._M_p = (pointer)&export_name.field_2;
  export_name._M_string_length = 0;
  export_name.field_2._M_local_buf[0] = '\0';
  if (exportHeader->_M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&header,"#include <");
    poVar1 = std::operator<<(poVar1,(string *)exportHeader);
    poVar1 = std::operator<<(poVar1,"_export.h>");
    std::endl<char,std::char_traits<char>>(poVar1);
    capitalize(&local_260,exportHeader,-1);
    std::operator+(&local_240,&local_260,"_EXPORT");
    std::__cxx11::string::operator=((string *)&export_name,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
  }
  poVar1 = std::operator<<((ostream *)&header,"#include <functional>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&header,"#include <QObject>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&header);
  dump_headers(&header,&conf->includes);
  if ((conf->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (conf->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::endl<char,std::char_traits<char>>((ostream *)&header);
  }
  if ((conf->conf_namespace)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&header,"namespace ");
    poVar1 = std::operator<<(poVar1,(string *)&conf->conf_namespace);
    poVar1 = std::operator<<(poVar1," {");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  if ((conf->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (conf->includes).super__Vector_base<MetaInclude,_std::allocator<MetaInclude>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::endl<char,std::char_traits<char>>((ostream *)&header);
  }
  top = (conf->top_level_class).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (top != (MetaClass *)0x0) {
    anon_unknown.dwarf_5a11f::dump_header_class(top,&header,&export_name);
  }
  if ((conf->conf_namespace)._M_string_length != 0) {
    poVar1 = std::operator<<((ostream *)&header,"}");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&header);
  poVar1 = std::operator<<((ostream *)&header,"// clang-format on");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&export_name);
  std::ofstream::~ofstream(&header);
  return;
}

Assistant:

void dump_header(
    const MetaConfiguration &conf,
    const std::string &filename,
    const std::string &exportHeader)
{
  qCDebug(dumpKConfigSource) << "Starting to dump the source file into" << filename;

  std::ofstream header(filename);
  // disable clang format for this, it's an automated file.

  header << "// clang-format off" << std::endl;

  begin_header_guards(header, filename);
  header << std::endl;

  dump_notice(header);

  std::string export_name;
  if (exportHeader.size() != 0) {
    header << "#include <" << exportHeader << "_export.h>" << std::endl;
    export_name = capitalize(exportHeader, -1) + "_EXPORT";
  }

  header << "#include <functional>" << std::endl;
  header << "#include <QObject>" << std::endl;

  header << std::endl;
  dump_headers(header, conf.includes);

  if (conf.includes.size()) {
    header << std::endl;
  }

  if (conf.conf_namespace.size()) {
    header << "namespace " << conf.conf_namespace << " {" << std::endl;
  }

  if (conf.includes.size()) {
    header << std::endl;
  }

  if (conf.top_level_class) {
    dump_header_class(conf.top_level_class.get(), header, export_name);
  }

  if (conf.conf_namespace.size()) {
    header << "}" << std::endl;
  }

  header << std::endl;
  header << "// clang-format on" << std::endl;
}